

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeLocalGet
          (SimplifyLocals<true,_true,_true> *this,LocalGet *curr)

{
  _Rb_tree_header *p_Var1;
  LocalSet *this_00;
  Type type_;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  Nop *output;
  const_iterator __position;
  bool bVar4;
  
  p_Var3 = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->sinkables)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      bVar4 = p_Var3[1]._M_color < curr->index;
      if (!bVar4) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar4];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (__position._M_node = p_Var2, curr->index < p_Var2[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    this_00 = *(LocalSet **)__position._M_node[1]._M_parent;
    if ((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
        LocalSetId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
    }
    if ((this->firstCycle == false) &&
       ((this->getCounter).num.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[curr->index] != 1)) {
      Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
      ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                       ,(Expression *)this_00);
      bVar4 = LocalSet::isTee(this_00);
      if (bVar4) {
        __assert_fail("!set->isTee()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x119,
                      "void wasm::SimplifyLocals<>::optimizeLocalGet(LocalGet *) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
      type_ = Function::getLocalType
                        ((this->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                         .
                         super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                         .
                         super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                         .currFunction,this_00->index);
      LocalSet::makeTee(this_00,type_);
    }
    else {
      Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
      ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                       ,this_00->value);
      if ((this_00->value->type).id !=
          (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id) {
        this->refinalize = true;
      }
    }
    *(LocalGet **)__position._M_node[1]._M_parent = curr;
    (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id = NopId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 0;
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
    ::_M_erase_aux(&(this->sinkables)._M_t,__position);
    this->anotherCycle = true;
  }
  return;
}

Assistant:

void optimizeLocalGet(LocalGet* curr) {
    auto found = sinkables.find(curr->index);
    if (found != sinkables.end()) {
      auto* set = (*found->second.item)
                    ->template cast<LocalSet>(); // the set we may be sinking
      bool oneUse = firstCycle || getCounter.num[curr->index] == 1;
      // the set's value may be a get (i.e., the set is a copy)
      auto* get = set->value->template dynCast<LocalGet>();
      // if nesting is not allowed, and this might cause nesting, check if the
      // sink would cause such a thing
      if (!allowNesting) {
        // a get is always ok to sink
        if (!get) {
          assert(expressionStack.size() >= 2);
          assert(expressionStack[expressionStack.size() - 1] == curr);
          auto* parent = expressionStack[expressionStack.size() - 2];
          bool parentIsSet = parent->template is<LocalSet>();
          // if the parent of this get is a set, we can sink into the set's
          // value, it would not be nested.
          if (!parentIsSet) {
            return;
          }
        }
      }
      // we can optimize here
      if (!allowNesting && get && !oneUse) {
        // if we can't nest 's a copy with multiple uses, then we can't create
        // a tee, and we can't nop the origin, but we can at least switch to
        // the copied index, which may make the origin unneeded eventually.
        curr->index = get->index;
        anotherCycle = true;
        return;
      }
      // sink it, and nop the origin
      if (oneUse) {
        // with just one use, we can sink just the value
        this->replaceCurrent(set->value);

        // We are replacing a local.get with the value of the local.set. That
        // may require a refinalize in certain cases, like this:
        //
        //  (struct.get $X 0
        //    (local.get $x)
        //  )
        //
        // If we replace the local.get with a more refined type then the
        // struct.get may read a more refined type (if the subtype has a more
        // refined type for that particular field). Note that this cannot happen
        // in the other arm of this if-else, where we replace the local.get with
        // a tee, since tees have the type of the local, so no types change
        // there.
        if (set->value->type != curr->type) {
          refinalize = true;
        }
      } else {
        this->replaceCurrent(set);
        assert(!set->isTee());
        set->makeTee(this->getFunction()->getLocalType(set->index));
      }
      // reuse the local.get that is dying
      *found->second.item = curr;
      ExpressionManipulator::nop(curr);
      sinkables.erase(found);
      anotherCycle = true;
    }
  }